

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O2

void __thiscall EchoServer::~EchoServer(EchoServer *this)

{
  std::_Function_base::~_Function_base((_Function_base *)&this->m_codec);
  sznet::net::KcpWithTcpServer::~KcpWithTcpServer(&this->m_server);
  return;
}

Assistant:

EchoServer(KcpTcpEventLoop* loop, const std::vector<InetAddress>& udpListenAddrs, const InetAddress& listenAddr, int mode = 1, int kcpMode = 1) :
        m_server(loop, listenAddr, udpListenAddrs, "EchoServer", kcpMode),
        m_transferred(0),
        m_receivedMessages(0),
        m_oldCounter(0),
        m_startTime(Timestamp::now()),
        m_codec(std::bind(&EchoServer::onMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
        m_mode(mode),
        m_kcpMode(kcpMode)

    {
        m_server.setKcpConnectionCallback(
            std::bind(&EchoServer::onConnection, this, std::placeholders::_1));
        m_server.setKcpMessageCallback(std::bind(&LengthHeaderCodec<KcpConnectionPtr>::onMessage, &m_codec,
            std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
        m_server.setThreadNum(numThreads);
        if (m_mode == 1)
        {
            loop->runEvery(3.0, std::bind(&EchoServer::printThroughput, this));
        }
    }